

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O2

void __thiscall
spdlog::details::level_formatter::format
          (level_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  long lVar1;
  memory_buffer *dest_00;
  string_view_t view;
  string_view_t view_00;
  scoped_pad p;
  scoped_pad sStack_38;
  
  lVar1 = (ulong)msg->level * 0x10;
  if ((this->super_flag_formatter).padinfo_.width_ != 0) {
    dest_00 = dest;
    scoped_pad::scoped_pad
              (&sStack_38,*(size_t *)(level::level_string_views + lVar1 + 8),
               &(this->super_flag_formatter).padinfo_,dest);
    view.size_ = (size_t)dest;
    view.data_ = *(char **)(level::level_string_views + lVar1 + 8);
    fmt_helper::append_string_view<500ul>
              (*(fmt_helper **)(level::level_string_views + lVar1),view,dest_00);
    scoped_pad::~scoped_pad(&sStack_38);
    return;
  }
  view_00.size_ = (size_t)dest;
  view_00.data_ = *(char **)(level::level_string_views + lVar1 + 8);
  fmt_helper::append_string_view<500ul>
            (*(fmt_helper **)(level::level_string_views + lVar1),view_00,dest);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        string_view_t &level_name = level::to_string_view(msg.level);
        if (padinfo_.enabled())
        {
            scoped_pad p(level_name, padinfo_, dest);
            fmt_helper::append_string_view(level_name, dest);
        }
        else
        {
            fmt_helper::append_string_view(level_name, dest);
        }
    }